

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O1

float google::protobuf::io::SafeDoubleToFloat(double value)

{
  bool bVar1;
  undefined *puVar2;
  
  if (value <= 3.4028234663852886e+38) {
    if (-3.4028234663852886e+38 <= value) {
      return (float)value;
    }
    bVar1 = value < -3.4028235677973366e+38;
    puVar2 = &DAT_0044a200;
  }
  else {
    bVar1 = 3.4028235677973366e+38 < value;
    puVar2 = &DAT_0044a210;
  }
  return *(float *)(puVar2 + (ulong)bVar1 * 4);
}

Assistant:

float SafeDoubleToFloat(double value) {
  // static_cast<float> on a number larger than float can result in illegal
  // instruction error, so we need to manually convert it to infinity or max.
  if (value > std::numeric_limits<float>::max()) {
    // Max float value is about 3.4028234664E38 when represented as a double.
    // However, when printing float as text, it will be rounded as
    // 3.4028235e+38. If we parse the value of 3.4028235e+38 from text and
    // compare it to 3.4028234664E38, we may think that it is larger, but
    // actually, any number between these two numbers could only be represented
    // as the same max float number in float, so we should treat them the same
    // as max float.
    if (value <= MAX_FLOAT_AS_DOUBLE_ROUNDED) {
      return std::numeric_limits<float>::max();
    }
    return std::numeric_limits<float>::infinity();
  } else if (value < -std::numeric_limits<float>::max()) {
    if (value >= -MAX_FLOAT_AS_DOUBLE_ROUNDED) {
      return -std::numeric_limits<float>::max();
    }
    return -std::numeric_limits<float>::infinity();
  } else {
    return static_cast<float>(value);
  }
}